

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O2

void __thiscall
Potassco::ProgramOptions::ContextError::ContextError
          (ContextError *this,string *ctx,Type t,string *key,string *alt)

{
  string local_68;
  string local_48;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  if (ctx->_M_string_length != 0) {
    std::__cxx11::string::append((char *)&local_68);
    quote(&local_48,ctx);
    std::__cxx11::string::append((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::append((char *)&local_68);
  }
  std::__cxx11::string::append((char *)&local_68);
  quote(&local_48,key);
  std::__cxx11::string::append((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  if ((t == ambiguous_option) && (alt->_M_string_length != 0)) {
    std::__cxx11::string::append((char *)&local_68);
    std::__cxx11::string::append((string *)&local_68);
  }
  Error::Error(&this->super_Error,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  *(undefined ***)&this->super_Error = &PTR__ContextError_0012b980;
  std::__cxx11::string::string((string *)&this->ctx_,(string *)ctx);
  std::__cxx11::string::string((string *)&this->key_,(string *)key);
  this->type_ = t;
  return;
}

Assistant:

ContextError::ContextError(const std::string& ctx, Type t, const std::string& key, const std::string& alt)
	: Error(format(t, ctx, key, alt))
	, ctx_(ctx)
	, key_(key)
	, type_(t) {
}